

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O0

void __thiscall qpdf::Array::checkOwnership(Array *this,QPDFObjectHandle *item)

{
  bool bVar1;
  logic_error *plVar2;
  QPDF *pQVar3;
  QPDF *pQVar4;
  QPDFObjectHandle *item_local;
  Array *this_local;
  
  bVar1 = BaseHandle::operator_cast_to_bool(&item->super_BaseHandle);
  if (!bVar1) {
    plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (plVar2,"Attempting to add an uninitialized object to a QPDF_Array.");
    __cxa_throw(plVar2,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  pQVar3 = BaseHandle::qpdf(&this->super_BaseHandle);
  if (pQVar3 != (QPDF *)0x0) {
    pQVar3 = BaseHandle::qpdf(&item->super_BaseHandle);
    if (pQVar3 != (QPDF *)0x0) {
      pQVar3 = BaseHandle::qpdf(&this->super_BaseHandle);
      pQVar4 = BaseHandle::qpdf(&item->super_BaseHandle);
      if (pQVar3 != pQVar4) {
        plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error
                  (plVar2,
                   "Attempting to add an object from a different QPDF. Use QPDF::copyForeignObject to add objects from another file."
                  );
        __cxa_throw(plVar2,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
    }
  }
  return;
}

Assistant:

inline void
Array::checkOwnership(QPDFObjectHandle const& item) const
{
    if (!item) {
        throw std::logic_error("Attempting to add an uninitialized object to a QPDF_Array.");
    }
    if (qpdf() && item.qpdf() && qpdf() != item.qpdf()) {
        throw std::logic_error(
            "Attempting to add an object from a different QPDF. Use "
            "QPDF::copyForeignObject to add objects from another file.");
    }
}